

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

size_t FileStream_Prefix(TCHAR *szFileName,DWORD *pdwProvider)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  char *__s1;
  
  uVar3 = 0;
  if (szFileName == (TCHAR *)0x0) {
LAB_0010dfe2:
    sVar5 = 0;
  }
  else {
    uVar4 = 5;
    iVar1 = strncasecmp(szFileName,"flat-",5);
    uVar2 = uVar4;
    if (iVar1 != 0) {
      iVar1 = strncasecmp(szFileName,"part-",5);
      if (iVar1 == 0) {
        uVar3 = 0x10;
      }
      else {
        iVar1 = strncasecmp(szFileName,"mpqe-",5);
        if (iVar1 != 0) {
          iVar1 = strncasecmp(szFileName,"blk4-",5);
          uVar2 = (ulong)(iVar1 == 0) * 5;
          uVar3 = 0x30;
          if (iVar1 != 0) {
            uVar3 = 0;
          }
          goto LAB_0010df95;
        }
        uVar3 = 0x20;
      }
      uVar2 = 5;
    }
LAB_0010df95:
    __s1 = szFileName + uVar2;
    iVar1 = strncasecmp(__s1,"file:",5);
    if (iVar1 != 0) {
      uVar4 = 4;
      iVar1 = strncasecmp(__s1,"map:",4);
      if (iVar1 == 0) {
        uVar3 = uVar3 | 1;
      }
      else {
        uVar4 = 5;
        iVar1 = strncasecmp(__s1,"http:",5);
        if (iVar1 != 0) goto LAB_0010dfe2;
        uVar3 = uVar3 | 2;
      }
    }
    if ((__s1[uVar4] == '/') && (__s1[uVar4 + 1] == '/')) {
      uVar4 = uVar4 | 2;
    }
    if (pdwProvider != (DWORD *)0x0) {
      *pdwProvider = uVar3;
    }
    sVar5 = uVar4 + uVar2;
  }
  return sVar5;
}

Assistant:

size_t FileStream_Prefix(const TCHAR * szFileName, DWORD * pdwProvider)
{
    size_t nPrefixLength1 = 0;
    size_t nPrefixLength2 = 0;
    DWORD dwProvider = 0;

    if(szFileName != NULL)
    {
        //
        // Determine the stream provider
        //

        if(!_tcsnicmp(szFileName, _T("flat-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_FLAT;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("part-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_PARTIAL;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("mpqe-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_ENCRYPTED;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("blk4-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_BLOCK4;
            nPrefixLength1 = 5;
        }

        //
        // Determine the base provider
        //

        if(!_tcsnicmp(szFileName+nPrefixLength1, _T("file:"), 5))
        {
            dwProvider |= BASE_PROVIDER_FILE;
            nPrefixLength2 = 5;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("map:"), 4))
        {
            dwProvider |= BASE_PROVIDER_MAP;
            nPrefixLength2 = 4;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("http:"), 5))
        {
            dwProvider |= BASE_PROVIDER_HTTP;
            nPrefixLength2 = 5;
        }

        // Only accept stream provider if we recognized the base provider
        if(nPrefixLength2 != 0)
        {
            // It is also allowed to put "//" after the base provider, e.g. "file://", "http://"
            if(szFileName[nPrefixLength1+nPrefixLength2] == '/' && szFileName[nPrefixLength1+nPrefixLength2+1] == '/')
                nPrefixLength2 += 2;

            if(pdwProvider != NULL)
                *pdwProvider = dwProvider;
            return nPrefixLength1 + nPrefixLength2;
        }
    }

    return 0;
}